

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_rock_sample.cpp
# Opt level: O3

undefined4 __thiscall
despot::RockSampleMMAPStateScenarioLowerBound::Value
          (RockSampleMMAPStateScenarioLowerBound *this,
          vector<despot::State_*,_std::allocator<despot::State_*>_> *particles,
          RandomStreams *streams,History *history)

{
  int iVar1;
  State *pSVar2;
  pointer pvVar3;
  pointer pCVar4;
  byte bVar5;
  uint uVar6;
  int iVar7;
  ulong uVar8;
  pointer piVar9;
  pointer ppSVar10;
  long lVar11;
  int iVar12;
  uint uVar13;
  ulong uVar14;
  uint uVar15;
  BaseRockSample *pBVar16;
  ulong uVar17;
  double dVar18;
  vector<double,_std::allocator<double>_> expected_sampling_value;
  int local_7c;
  undefined8 local_78;
  RockSampleMMAPStateScenarioLowerBound *local_70;
  double local_68;
  double local_60;
  vector<double,_std::allocator<double>_> local_58;
  undefined4 local_40 [4];
  
  std::vector<double,_std::allocator<double>_>::vector
            (&local_58,(long)this->rs_model_->num_rocks_,(allocator_type *)&local_78);
  despot::Coord::Coord((Coord *)&local_78,-1,-1);
  ppSVar10 = (particles->super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>).
             _M_impl.super__Vector_impl_data._M_start;
  pBVar16 = this->rs_model_;
  uVar6 = pBVar16->num_rocks_;
  uVar8 = (ulong)uVar6;
  if ((particles->super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>)._M_impl.
      super__Vector_impl_data._M_finish == ppSVar10) {
    uVar13 = 0;
    local_60 = 0.0;
  }
  else {
    local_60 = 0.0;
    uVar17 = 0;
    local_70 = this;
    do {
      bVar5 = (byte)uVar8;
      pSVar2 = ppSVar10[uVar17];
      iVar12 = *(int *)(pSVar2 + 0xc) >> (bVar5 & 0x1f);
      local_78 = Grid<int>::GetCoord(&pBVar16->grid_,iVar12);
      pBVar16 = local_70->rs_model_;
      uVar6 = pBVar16->num_rocks_;
      uVar8 = (ulong)(int)uVar6;
      if (0 < (long)uVar8) {
        uVar13 = *(uint *)(pSVar2 + 0xc);
        uVar14 = 0;
        do {
          local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[uVar14] =
               *(double *)(pSVar2 + 0x18) *
               *(double *)(&DAT_00115060 + (ulong)((uVar13 >> ((uint)uVar14 & 0x1f) & 1) == 0) * 8)
               + local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar14];
          uVar14 = uVar14 + 1;
        } while (uVar8 != uVar14);
      }
      local_60 = local_60 + *(double *)(pSVar2 + 0x18);
      uVar17 = uVar17 + 1;
      ppSVar10 = (particles->super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>).
                 _M_impl.super__Vector_impl_data._M_start;
    } while (uVar17 < (ulong)((long)(particles->
                                    super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>
                                    )._M_impl.super__Vector_impl_data._M_finish - (long)ppSVar10 >>
                             3));
    uVar13 = iVar12 << (bVar5 & 0x1f);
    this = local_70;
  }
  if (0 < (int)uVar6) {
    uVar8 = 0;
    do {
      uVar15 = 1 << ((byte)uVar8 & 0x1f);
      if (local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[uVar8] / local_60 <= 0.0) {
        uVar15 = 0;
      }
      uVar13 = uVar13 | uVar15;
      uVar8 = uVar8 + 1;
    } while (uVar6 != uVar8);
  }
  pvVar3 = (this->rock_order_).
           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  piVar9 = pvVar3[(int)uVar13].super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (*(pointer *)
       ((long)&pvVar3[(int)uVar13].super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data + 8) == piVar9) {
    local_68 = 1.0;
    local_70 = (RockSampleMMAPStateScenarioLowerBound *)0x0;
    local_7c = -1;
  }
  else {
    local_7c = -1;
    local_70 = (RockSampleMMAPStateScenarioLowerBound *)0x0;
    local_68 = 1.0;
    uVar8 = 0;
    do {
      lVar11 = (long)piVar9[uVar8];
      pCVar4 = (this->rs_model_->rock_pos_).
               super__Vector_base<despot::Coord,_std::allocator<despot::Coord>_>._M_impl.
               super__Vector_impl_data._M_start;
      iVar12 = *(int *)(pCVar4 + lVar11 * 8);
      iVar1 = *(int *)(pCVar4 + lVar11 * 8 + 4);
      if (local_7c == -1) {
        local_7c = 3;
        if (((int)local_78 <= iVar12) && (local_7c = 1, iVar12 <= (int)local_78)) {
          local_7c = 2;
          if (local_78._4_4_ <= iVar1) {
            local_7c = (uint)(iVar1 <= local_78._4_4_) << 2;
          }
        }
      }
      iVar7 = despot::Coord::ManhattanDistance(CONCAT44(iVar1,iVar12),local_78);
      dVar18 = pow(_ParticleBelief,(double)iVar7);
      local_68 = local_68 * dVar18;
      local_70 = (RockSampleMMAPStateScenarioLowerBound *)
                 ((double)local_70 +
                 local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar11] * local_68);
      local_78 = CONCAT44(iVar1,iVar12);
      uVar8 = uVar8 + 1;
      pvVar3 = (this->rock_order_).
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      piVar9 = pvVar3[(int)uVar13].super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
    } while (uVar8 < (ulong)((long)*(pointer *)
                                    ((long)&pvVar3[(int)uVar13].
                                            super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                            super__Vector_impl_data + 8) - (long)piVar9 >> 2));
  }
  dVar18 = pow(_ParticleBelief,(double)(this->grid_->xsize_ - (int)local_78));
  iVar12 = 1;
  if (local_7c != -1) {
    iVar12 = local_7c;
  }
  despot::ValuedAction::ValuedAction
            ((ValuedAction *)local_40,iVar12,dVar18 * local_60 * 10.0 * local_68 + (double)local_70)
  ;
  if (local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return local_40[0];
}

Assistant:

ValuedAction Value(const vector<State*>& particles, RandomStreams& streams,
		History& history) const {
		vector<double> expected_sampling_value = vector<double>(
			rs_model_->num_rocks_);
		int state = 0;
		Coord rob_pos(-1, -1);
		double total_weight = 0;
		for (int i = 0; i < particles.size(); i++) {
			State* particle = particles[i];
			state = (1 << rs_model_->num_rocks_)
				* rs_model_->GetRobPosIndex(particle);
			rob_pos = rs_model_->GetRobPos(particle);
			for (int r = 0; r < rs_model_->num_rocks_; r++) {
				expected_sampling_value[r] += particle->weight
					* (CheckFlag(particle->state_id, r) ? 10 : -10);
			}
			total_weight += particle->weight;
		}

		for (int rock = 0; rock < rs_model_->num_rocks_; rock++)
			if (expected_sampling_value[rock] / total_weight > 0.0)
				SetFlag(state, rock);

		ACT_TYPE action = -1;
		double value = 0;
		double discount = 1.0;
		for (int r = 0; r < rock_order_[state].size(); r++) {
			int rock = rock_order_[state][r];
			Coord rock_pos = rs_model_->rock_pos_[rock];

			if (action == -1) {
				if (rock_pos.x < rob_pos.x)
					action = Compass::WEST;
				else if (rock_pos.x > rob_pos.x)
					action = Compass::EAST;
				else if (rock_pos.y < rob_pos.y)
					action = Compass::SOUTH;
				else if (rock_pos.y > rob_pos.y)
					action = Compass::NORTH;
				else
					action = rs_model_->E_SAMPLE;
			}

			discount *= Globals::Discount(Coord::ManhattanDistance(rock_pos, rob_pos));
			value += discount * expected_sampling_value[rock];
			rob_pos = rock_pos;
		}

		if (action == -1)
			action = Compass::EAST;

		value += 10 * total_weight * discount
			* Globals::Discount(grid_.xsize() - rob_pos.x);

		return ValuedAction(action, value);
	}